

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_iq2_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *pfVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  char cVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  int *piVar11;
  bool bVar12;
  bool bVar13;
  int i;
  long lVar14;
  long lVar15;
  undefined1 *puVar16;
  ulong uVar17;
  byte *pbVar18;
  float *pfVar19;
  char *pcVar20;
  ushort uVar21;
  float fVar22;
  float *pfVar23;
  ulong uVar24;
  int i_2;
  int iVar25;
  ulong *puVar26;
  int i_1;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  short sVar31;
  anon_union_4_2_5fd15f10 fp32;
  undefined1 auVar35 [12];
  float fVar32;
  float fVar33;
  float fVar58;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined4 uVar59;
  undefined1 auVar47 [16];
  undefined1 auVar56 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar60;
  int iVar64;
  int iVar65;
  undefined1 auVar61 [16];
  int iVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int8_t Laux [16];
  int8_t L [16];
  float xval [16];
  float weight [16];
  float waux [16];
  float scales [16];
  byte local_25c;
  byte local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  ulong local_258;
  float local_250;
  uint local_24c;
  ulong local_248 [4];
  float *local_228;
  ushort *local_220;
  float *local_218;
  float *local_210;
  uint16_t *local_208;
  float local_200;
  float local_1fc;
  ulong local_1f8 [2];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  void *local_1c0;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  uint64_t *local_1a0;
  long local_198;
  long local_190;
  int64_t local_188;
  long local_180;
  long local_178;
  float *local_170;
  undefined1 local_168 [16];
  float local_158 [4];
  uint auStack_148 [4];
  float local_138 [8];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float afStack_f8 [32];
  float afStack_78 [18];
  char cVar5;
  char cVar6;
  char cVar7;
  undefined6 uVar34;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 uVar57;
  undefined1 auVar77 [16];
  
  local_1b0 = quant_weights;
  local_1c0 = dst;
  local_218 = src;
  if ((char)n_per_row != '\0') {
    pcVar20 = "n_per_row%QK_K == 0";
    iVar25 = 0x1336;
LAB_0013aaac:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,iVar25,"GGML_ASSERT(%s) failed",pcVar20);
  }
  local_248[3] = n_per_row >> 8;
  if (0 < nrow) {
    local_198 = local_248[3] * 0x52;
    lVar15 = 0;
    local_188 = nrow;
    local_190 = n_per_row << 2;
    auVar83 = _DAT_0014e970;
    auVar84 = _DAT_0014e770;
    auVar85 = _DAT_0014e740;
    do {
      piVar11 = iq2_data[3].map;
      if (iq2_data[3].map == (int *)0x0) {
        pcVar20 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar25 = 0x1295;
        goto LAB_0013aaac;
      }
      local_1a0 = iq2_data[3].grid;
      if (iq2_data[3].grid == (uint64_t *)0x0) {
        pcVar20 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar25 = 0x1296;
        goto LAB_0013aaac;
      }
      local_208 = iq2_data[3].neighbours;
      if (iq2_data[3].neighbours == (uint16_t *)0x0) {
        pcVar20 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar25 = 0x1297;
        goto LAB_0013aaac;
      }
      local_180 = lVar15;
      if (0 < (long)local_248[3]) {
        local_208 = iq2_data[3].neighbours + -1;
        local_1b8 = local_1b0;
        lVar15 = 0;
        pfVar19 = local_218;
        do {
          lVar14 = lVar15 * 0x52;
          local_220 = (ushort *)((long)local_1c0 + lVar14);
          local_178 = lVar15;
          local_170 = local_218 + lVar15 * 0x100;
          puVar2 = (undefined8 *)((long)local_1c0 + lVar14 + 0x40);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)local_1c0 + lVar14 + 0x30);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)local_1c0 + lVar14 + 0x20);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)local_1c0 + lVar14 + 0x10);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)local_1c0 + lVar14) = 0;
          ((undefined8 *)((long)local_1c0 + lVar14))[1] = 0;
          *(undefined2 *)((long)local_1c0 + lVar14 + 0x50) = 0;
          fVar60 = 0.0;
          lVar15 = 0;
          do {
            fVar60 = fVar60 + pfVar19[lVar15] * pfVar19[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x100);
          local_118 = (fVar60 + fVar60) * 0.00390625;
          fStack_114 = local_118;
          fStack_110 = local_118;
          fStack_10c = local_118;
          fVar60 = 0.0;
          local_1a8 = local_1b8;
          uVar17 = 0;
          local_108 = local_118;
          uStack_104 = 0;
          uStack_100 = 0;
          uStack_fc = 0;
          local_228 = pfVar19;
          local_210 = pfVar19;
          do {
            local_258 = uVar17;
            local_250 = fVar60;
            if (local_1b0 == (float *)0x0) {
              lVar15 = 0;
              do {
                pfVar19 = local_210 + lVar15;
                fVar60 = pfVar19[1];
                fVar22 = pfVar19[2];
                fVar33 = pfVar19[3];
                afStack_f8[lVar15] = local_118 * 0.25 + *pfVar19 * *pfVar19;
                afStack_f8[lVar15 + 1] = fStack_114 * 0.25 + fVar60 * fVar60;
                afStack_f8[lVar15 + 2] = fStack_110 * 0.25 + fVar22 * fVar22;
                afStack_f8[lVar15 + 3] = fStack_10c * 0.25 + fVar33 * fVar33;
                lVar15 = lVar15 + 4;
              } while (lVar15 != 0x10);
            }
            else {
              lVar15 = 0;
              do {
                fVar60 = local_210[lVar15] * local_210[lVar15] + local_108;
                if (fVar60 < 0.0) {
                  local_1d8 = local_1a8[lVar15];
                  fVar60 = sqrtf(fVar60);
                  auVar83 = _DAT_0014e970;
                  auVar84 = _DAT_0014e770;
                  auVar85 = _DAT_0014e740;
                  fVar22 = local_1d8;
                }
                else {
                  fVar60 = SQRT(fVar60);
                  fVar22 = local_1a8[lVar15];
                }
                afStack_f8[lVar15] = fVar22 * fVar60;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
            }
            pfVar19 = local_170;
            uVar17 = local_258;
            lVar15 = 0;
            do {
              fVar60 = afStack_f8[lVar15];
              if (fVar60 < 0.0) {
                fVar60 = sqrtf(fVar60);
                auVar83 = _DAT_0014e970;
                auVar84 = _DAT_0014e770;
                auVar85 = _DAT_0014e740;
              }
              else {
                fVar60 = SQRT(fVar60);
              }
              afStack_f8[lVar15 + 0x10] = fVar60;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            lVar15 = 0;
            pbVar18 = &local_25b;
            pfVar23 = local_158;
            bVar12 = true;
            do {
              bVar13 = bVar12;
              pfVar1 = pfVar19 + uVar17 * 0x10 + lVar15;
              fVar60 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar33 = pfVar1[2];
              fVar67 = pfVar1[3];
              uVar27 = -(uint)(fVar60 < -fVar60);
              uVar28 = -(uint)(fVar22 < -fVar22);
              uVar29 = -(uint)(fVar33 < -fVar33);
              uVar30 = -(uint)(fVar67 < -fVar67);
              auVar81._0_8_ = CONCAT44(uVar28,uVar27);
              auVar81._8_4_ = uVar29;
              auVar81._12_4_ = uVar30;
              auVar71._8_4_ = uVar29;
              auVar71._0_8_ = auVar81._0_8_;
              auVar71._12_4_ = uVar30;
              auVar72 = packssdw(auVar71,auVar81);
              auVar72 = packsswb(auVar72,auVar72);
              *pfVar23 = (float)(~uVar27 & (uint)fVar60 | (uint)-fVar60 & uVar27);
              pfVar23[1] = (float)(~uVar28 & (uint)fVar22 | (uint)-fVar22 & uVar28);
              pfVar23[2] = (float)(~uVar29 & (uint)fVar33 | (uint)-fVar33 & uVar29);
              pfVar23[3] = (float)(~uVar30 & (uint)fVar67 | (uint)-fVar67 & uVar30);
              pfVar23 = pfVar19 + uVar17 * 0x10 + lVar15 + 4;
              fVar60 = *pfVar23;
              fVar22 = pfVar23[1];
              fVar33 = pfVar23[2];
              fVar67 = pfVar23[3];
              uVar27 = -(uint)(fVar60 < -fVar60);
              uVar28 = -(uint)(fVar22 < -fVar22);
              uVar29 = -(uint)(fVar33 < -fVar33);
              uVar30 = -(uint)(fVar67 < -fVar67);
              auVar75._0_8_ = CONCAT44(uVar28,uVar27);
              auVar75._8_4_ = uVar29;
              auVar75._12_4_ = uVar30;
              auVar80._8_4_ = uVar29;
              auVar80._0_8_ = auVar75._0_8_;
              auVar80._12_4_ = uVar30;
              auVar81 = packssdw(auVar80,auVar75);
              auVar81 = packsswb(auVar81,auVar81);
              auVar81 = auVar81 & ZEXT416(0x80402010) | auVar72 & ZEXT416(0x8040201);
              auStack_148[lVar15] = ~uVar27 & (uint)fVar60 | (uint)-fVar60 & uVar27;
              auStack_148[lVar15 + 1] = ~uVar28 & (uint)fVar22 | (uint)-fVar22 & uVar28;
              auStack_148[lVar15 + 2] = ~uVar29 & (uint)fVar33 | (uint)-fVar33 & uVar29;
              auStack_148[lVar15 + 3] = ~uVar30 & (uint)fVar67 | (uint)-fVar67 & uVar30;
              auVar72._0_4_ = auVar81._0_4_ >> 0x10;
              auVar72._4_4_ = 0;
              auVar72._8_4_ = auVar81._8_4_ >> 0x10;
              auVar72._12_4_ = auVar81._12_4_ >> 0x10;
              *pbVar18 = SUB161(auVar72 | auVar81,1) | SUB161(auVar72 | auVar81,0);
              lVar15 = 8;
              pbVar18 = &local_25c;
              pfVar23 = local_138;
              bVar12 = false;
            } while (bVar13);
            lVar15 = 1;
            fVar60 = local_158[0];
            do {
              if (fVar60 <= local_158[lVar15]) {
                fVar60 = local_158[lVar15];
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            if (1e-08 <= fVar60) {
              local_1e8 = ZEXT416((uint)(fVar60 / 5.0));
              iVar25 = -9;
              local_168._0_12_ = ZEXT812(0);
              local_168._12_4_ = 0;
              local_24c = (uint)CONCAT62((int6)(local_258 >> 0x10),0x101);
              auVar72 = _DAT_0014e940;
              local_200 = fVar60;
              do {
                fVar67 = ((float)iVar25 * 0.1 + 5.0) / local_200;
                local_1fc = 1.0 / fVar67;
                puVar26 = local_248;
                lVar15 = 0;
                local_1d8 = fVar67;
                fStack_1d4 = fVar67;
                fStack_1d0 = fVar67;
                fStack_1cc = fVar67;
                puVar16 = &local_259;
                pfVar19 = afStack_f8 + 0x10;
                pfVar23 = local_158;
                bVar12 = true;
                fVar60 = fVar67;
                fVar22 = fVar67;
                fVar33 = fVar67;
                do {
                  bVar13 = bVar12;
                  lVar14 = 0;
                  do {
                    pfVar1 = local_158 + lVar15 + lVar14;
                    fVar32 = (*pfVar1 * fVar67 + -1.0) * 0.5 + 12582912.0;
                    fVar58 = (pfVar1[1] * fVar60 + -1.0) * 0.5 + 12582912.0;
                    auVar36._0_8_ = CONCAT44(fVar58,fVar32) & 0x7fffff007fffff;
                    auVar36._8_4_ =
                         (uint)((pfVar1[2] * fVar22 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar36._12_4_ =
                         (uint)((pfVar1[3] * fVar33 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar61._0_4_ = -(uint)((int)((uint)fVar32 & 0x7fffff) < auVar83._0_4_);
                    auVar61._4_4_ = -(uint)((int)((uint)fVar58 & 0x7fffff) < auVar83._4_4_);
                    auVar61._8_4_ = -(uint)((int)auVar36._8_4_ < auVar83._8_4_);
                    auVar61._12_4_ = -(uint)((int)auVar36._12_4_ < auVar83._12_4_);
                    auVar81 = ~auVar61 & auVar83 | auVar36 & auVar61;
                    auVar37._0_4_ = -(uint)(auVar84._0_4_ < auVar81._0_4_);
                    auVar37._4_4_ = -(uint)(auVar84._4_4_ < auVar81._4_4_);
                    auVar37._8_4_ = -(uint)(auVar84._8_4_ < auVar81._8_4_);
                    auVar37._12_4_ = -(uint)(auVar84._12_4_ < auVar81._12_4_);
                    auVar81 = auVar37 & auVar81 & auVar85;
                    sVar8 = auVar81._0_2_;
                    cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0] - (0xff < sVar8);
                    sVar8 = auVar81._2_2_;
                    sVar31 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar81[2] - (0xff < sVar8),
                                      cVar4);
                    sVar8 = auVar81._4_2_;
                    cVar5 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[4] - (0xff < sVar8);
                    sVar8 = auVar81._6_2_;
                    uVar59 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar81[6] - (0xff < sVar8),
                                      CONCAT12(cVar5,sVar31));
                    sVar8 = auVar81._8_2_;
                    cVar6 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[8] - (0xff < sVar8);
                    sVar8 = auVar81._10_2_;
                    uVar34 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar81[10] - (0xff < sVar8),
                                      CONCAT14(cVar6,uVar59));
                    sVar8 = auVar81._12_2_;
                    cVar7 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0xc] - (0xff < sVar8);
                    sVar10 = auVar81._14_2_;
                    sVar8 = (short)((uint)uVar59 >> 0x10);
                    sVar9 = (short)((uint6)uVar34 >> 0x20);
                    sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar81[0xe] -
                                              (0xff < sVar10),CONCAT16(cVar7,uVar34)) >> 0x30);
                    *(uint *)((long)local_248 + lVar14 + lVar15) =
                         CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                                  CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                           CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar5 -
                                                    (0xff < sVar8),
                                                    (0 < sVar31) * (sVar31 < 0x100) * cVar4 -
                                                    (0xff < sVar31))));
                    lVar14 = lVar14 + 4;
                  } while (lVar14 != 8);
                  uVar17 = *(ulong *)((long)local_248 + lVar15);
                  uVar57 = (undefined1)(uVar17 >> 0x38);
                  auVar45._8_6_ = 0;
                  auVar45._0_8_ = uVar17;
                  auVar45[0xe] = uVar57;
                  auVar45[0xf] = uVar57;
                  uVar57 = (undefined1)(uVar17 >> 0x30);
                  auVar44._14_2_ = auVar45._14_2_;
                  auVar44._8_5_ = 0;
                  auVar44._0_8_ = uVar17;
                  auVar44[0xd] = uVar57;
                  auVar43._13_3_ = auVar44._13_3_;
                  auVar43._8_4_ = 0;
                  auVar43._0_8_ = uVar17;
                  auVar43[0xc] = uVar57;
                  uVar57 = (undefined1)(uVar17 >> 0x28);
                  auVar42._12_4_ = auVar43._12_4_;
                  auVar42._8_3_ = 0;
                  auVar42._0_8_ = uVar17;
                  auVar42[0xb] = uVar57;
                  auVar41._11_5_ = auVar42._11_5_;
                  auVar41._8_2_ = 0;
                  auVar41._0_8_ = uVar17;
                  auVar41[10] = uVar57;
                  uVar57 = (undefined1)(uVar17 >> 0x20);
                  auVar40._10_6_ = auVar41._10_6_;
                  auVar40[8] = 0;
                  auVar40._0_8_ = uVar17;
                  auVar40[9] = uVar57;
                  auVar39._9_7_ = auVar40._9_7_;
                  auVar39[8] = uVar57;
                  auVar39._0_8_ = uVar17;
                  uVar57 = (undefined1)(uVar17 >> 0x18);
                  auVar38._8_8_ = auVar39._8_8_;
                  auVar38[7] = uVar57;
                  auVar38[6] = uVar57;
                  uVar57 = (undefined1)(uVar17 >> 0x10);
                  auVar38[5] = uVar57;
                  auVar38[4] = uVar57;
                  uVar57 = (undefined1)(uVar17 >> 8);
                  auVar38[3] = uVar57;
                  auVar38[2] = uVar57;
                  auVar38[0] = (undefined1)uVar17;
                  auVar38[1] = auVar38[0];
                  auVar81 = psraw(auVar38,8);
                  iVar64 = piVar11[(ushort)(auVar81._14_2_ * auVar72._14_2_ |
                                            auVar81._6_2_ * auVar72._6_2_ |
                                            auVar81._10_2_ * auVar72._10_2_ |
                                            auVar81._2_2_ * auVar72._2_2_ |
                                           auVar81._12_2_ * auVar72._12_2_ |
                                           auVar81._4_2_ * auVar72._4_2_ |
                                           auVar81._8_2_ * auVar72._8_2_ |
                                           auVar81._0_2_ * auVar72._0_2_)];
                  *puVar16 = 1;
                  if ((long)iVar64 < 0) {
                    *puVar16 = 0;
                    iq2_find_best_neighbour
                              (local_208 + -(long)iVar64,local_1a0,pfVar23,pfVar19,local_1fc,
                               (int8_t *)puVar26);
                    auVar72 = _DAT_0014e940;
                    auVar83 = _DAT_0014e970;
                    auVar84 = _DAT_0014e770;
                    auVar85 = _DAT_0014e740;
                    fVar67 = local_1d8;
                    fVar60 = fStack_1d4;
                    fVar22 = fStack_1d0;
                    fVar33 = fStack_1cc;
                  }
                  puVar26 = local_248 + 1;
                  lVar15 = 8;
                  puVar16 = &local_25a;
                  pfVar19 = afStack_f8 + 0x18;
                  pfVar23 = local_138;
                  bVar12 = false;
                } while (bVar13);
                lVar15 = 0;
                auVar81 = (undefined1  [16])0x0;
                do {
                  fVar67 = (float)(*(char *)((long)local_248 + lVar15) * 2 + 1);
                  fVar60 = afStack_f8[lVar15];
                  fVar22 = auVar81._0_4_ + fVar67 * local_158[lVar15] * fVar60;
                  fVar33 = auVar81._4_4_ + fVar67 * fVar67 * fVar60;
                  auVar46._0_8_ = CONCAT44(fVar33,fVar22);
                  auVar46._8_4_ = auVar81._8_4_ + fVar67 * fVar60 * 0.0;
                  auVar46._12_4_ = auVar81._12_4_ + fVar67 * fVar60 * 0.0;
                  lVar15 = lVar15 + 1;
                  auVar81 = auVar46;
                } while (lVar15 != 0x10);
                if ((0.0 < fVar33) && ((float)local_168._0_4_ * fVar33 < fVar22 * fVar22)) {
                  auVar68._8_4_ = auVar46._8_4_;
                  auVar68._0_8_ = auVar46._0_8_;
                  auVar68._12_4_ = auVar46._12_4_;
                  local_1e8._4_12_ = auVar68._4_12_;
                  local_1e8._0_4_ = fVar22 / fVar33;
                  local_1f8[0] = local_248[0];
                  local_1f8[1] = local_248[1];
                  local_24c = (uint)CONCAT11(local_25a,local_259);
                  local_168._4_12_ = auVar46._4_12_;
                  local_168._0_4_ = fVar22 * (float)local_1e8._0_4_;
                }
                iVar25 = iVar25 + 1;
              } while (iVar25 != 10);
              uVar27 = local_24c & 0xffff;
              auVar81 = local_1e8;
              if ((uVar27 < 0x100 || (char)local_24c == '\0') && (0.0 < local_1e8._0_4_)) {
                fVar60 = 1.0 / local_1e8._0_4_;
                puVar26 = local_1f8;
                lVar15 = 0;
                local_1d8 = fVar60;
                fStack_1d4 = fVar60;
                fStack_1d0 = fVar60;
                fStack_1cc = fVar60;
                pfVar19 = afStack_f8 + 0x10;
                pfVar23 = local_158;
                fVar22 = fVar60;
                fVar33 = fVar60;
                fVar67 = fVar60;
                uVar28 = local_24c;
                bVar12 = true;
                do {
                  bVar13 = bVar12;
                  if ((uVar28 & 1) == 0) {
                    auVar72 = ZEXT816(0);
                    lVar14 = 0;
                    iVar25 = 0;
                    iVar64 = 1;
                    iVar65 = 2;
                    iVar66 = 3;
                    do {
                      pfVar1 = local_158 + lVar15 + lVar14;
                      fVar32 = (*pfVar1 * fVar60 + -1.0) * 0.5 + 12582912.0;
                      fVar58 = (pfVar1[1] * fVar22 + -1.0) * 0.5 + 12582912.0;
                      auVar73._0_8_ = CONCAT44(fVar58,fVar32) & 0x7fffff007fffff;
                      auVar73._8_4_ =
                           (uint)((pfVar1[2] * fVar33 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar73._12_4_ =
                           (uint)((pfVar1[3] * fVar67 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar69._0_4_ = -(uint)((int)((uint)fVar32 & 0x7fffff) < auVar83._0_4_);
                      auVar69._4_4_ = -(uint)((int)((uint)fVar58 & 0x7fffff) < auVar83._4_4_);
                      auVar69._8_4_ = -(uint)((int)auVar73._8_4_ < auVar83._8_4_);
                      auVar69._12_4_ = -(uint)((int)auVar73._12_4_ < auVar83._12_4_);
                      auVar81 = ~auVar69 & auVar83 | auVar73 & auVar69;
                      auVar74._0_4_ = -(uint)(auVar84._0_4_ < auVar81._0_4_);
                      auVar74._4_4_ = -(uint)(auVar84._4_4_ < auVar81._4_4_);
                      auVar74._8_4_ = -(uint)(auVar84._8_4_ < auVar81._8_4_);
                      auVar74._12_4_ = -(uint)(auVar84._12_4_ < auVar81._12_4_);
                      auVar75 = ~auVar74 & auVar84 | auVar81 & auVar74;
                      auVar82._4_4_ = (int)(float)(iVar64 * 0x1000000 + 0x3f800000);
                      auVar82._12_4_ = (int)(float)(iVar66 * 0x1000000 + 0x3f800000);
                      auVar76._0_4_ = auVar75._0_4_ * (int)(float)(iVar25 * 0x1000000 + 0x3f800000);
                      auVar77._8_4_ =
                           (undefined4)
                           ((auVar75._8_8_ & 0xffffffff) *
                           (ulong)(uint)(int)(float)(iVar65 * 0x1000000 + 0x3f800000));
                      auVar77._4_4_ = auVar77._8_4_;
                      auVar77._0_4_ = auVar76._0_4_;
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      auVar77._12_4_ = (int)((auVar82._8_8_ & 0xffffffff) * (ulong)auVar75._12_4_);
                      auVar76._8_8_ = auVar77._8_8_;
                      auVar76._4_4_ = auVar82._4_4_ * auVar75._4_4_;
                      auVar75 = pshuflw(auVar76,auVar76,0xe8);
                      auVar75 = pshufhw(auVar75,auVar75,0xe8);
                      auVar78._0_4_ = auVar75._0_4_;
                      auVar78._8_4_ = auVar75._8_4_;
                      auVar78._12_4_ = auVar75._12_4_;
                      auVar78._4_4_ = auVar78._8_4_;
                      auVar72 = auVar72 | auVar78;
                      auVar81 = auVar81 & auVar74 & auVar85;
                      sVar8 = auVar81._0_2_;
                      cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0] - (0xff < sVar8);
                      sVar8 = auVar81._2_2_;
                      sVar31 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar81[2] - (0xff < sVar8),
                                        cVar4);
                      sVar8 = auVar81._4_2_;
                      cVar5 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[4] - (0xff < sVar8);
                      sVar8 = auVar81._6_2_;
                      uVar59 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar81[6] - (0xff < sVar8),
                                        CONCAT12(cVar5,sVar31));
                      sVar8 = auVar81._8_2_;
                      cVar6 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[8] - (0xff < sVar8);
                      sVar8 = auVar81._10_2_;
                      uVar34 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar81[10] - (0xff < sVar8)
                                        ,CONCAT14(cVar6,uVar59));
                      sVar8 = auVar81._12_2_;
                      cVar7 = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0xc] - (0xff < sVar8);
                      sVar10 = auVar81._14_2_;
                      sVar8 = (short)((uint)uVar59 >> 0x10);
                      sVar9 = (short)((uint6)uVar34 >> 0x20);
                      sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar81[0xe] -
                                                (0xff < sVar10),CONCAT16(cVar7,uVar34)) >> 0x30);
                      *(uint *)((long)local_1f8 + lVar14 + lVar15) =
                           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                                    CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                             CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar5 -
                                                      (0xff < sVar8),
                                                      (0 < sVar31) * (sVar31 < 0x100) * cVar4 -
                                                      (0xff < sVar31))));
                      lVar14 = lVar14 + 4;
                      iVar25 = iVar25 + 4;
                      iVar64 = iVar64 + 4;
                      iVar65 = iVar65 + 4;
                      iVar66 = iVar66 + 4;
                    } while (lVar14 != 8);
                    uVar59 = auVar72._4_4_;
                    auVar62._4_4_ = uVar59;
                    auVar62._0_4_ = uVar59;
                    auVar62._8_4_ = uVar59;
                    auVar62._12_4_ = uVar59;
                    if ((long)piVar11[(ushort)(SUB162(auVar62 | auVar72,2) |
                                              SUB162(auVar62 | auVar72,0))] < 0) {
                      iq2_find_best_neighbour
                                (local_208 +
                                 -(long)piVar11[(ushort)(SUB162(auVar62 | auVar72,2) |
                                                        SUB162(auVar62 | auVar72,0))],local_1a0,
                                 pfVar23,pfVar19,(float)local_1e8._0_4_,(int8_t *)puVar26);
                      auVar83 = _DAT_0014e970;
                      auVar84 = _DAT_0014e770;
                      auVar85 = _DAT_0014e740;
                      fVar60 = local_1d8;
                      fVar22 = fStack_1d4;
                      fVar33 = fStack_1d0;
                      fVar67 = fStack_1cc;
                    }
                  }
                  lVar15 = 8;
                  puVar26 = local_1f8 + 1;
                  pfVar19 = afStack_f8 + 0x18;
                  pfVar23 = local_138;
                  uVar28 = uVar27 >> 8;
                  bVar12 = false;
                } while (bVar13);
                fVar60 = 0.0;
                fVar22 = 0.0;
                lVar15 = 0;
                do {
                  fVar33 = (float)(*(char *)((long)local_1f8 + lVar15) * 2 + 1);
                  fVar60 = fVar60 + fVar33 * fVar33 * afStack_f8[lVar15];
                  fVar22 = fVar22 + fVar33 * local_158[lVar15] * afStack_f8[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                auVar70._0_4_ = ~-(uint)(0.0 < fVar60) & local_1e8._0_4_;
                auVar70._4_4_ = local_1e8._4_4_;
                auVar70._8_4_ = local_1e8._8_4_;
                auVar70._12_4_ = local_1e8._12_4_;
                auVar81 = auVar70 | ZEXT416((uint)(fVar22 / fVar60) & -(uint)(0.0 < fVar60));
                auVar72 = _DAT_0014e940;
              }
              auVar79 = auVar81;
              if (auVar81._0_4_ < 0.0) {
                local_25b = ~local_25b;
                local_25c = ~local_25c;
                auVar79._0_4_ = -auVar81._0_4_;
                auVar79._4_4_ = 0;
                auVar79._8_4_ = auVar81._8_4_ ^ 0x80000000;
                auVar79._12_4_ = auVar81._12_4_ ^ 0x80000000;
              }
              uVar17 = 0;
              pbVar18 = &local_25b;
              bVar12 = true;
              do {
                bVar13 = bVar12;
                uVar24 = local_1f8[uVar17];
                uVar57 = (undefined1)(uVar24 >> 0x38);
                auVar54._8_6_ = 0;
                auVar54._0_8_ = uVar24;
                auVar54[0xe] = uVar57;
                auVar54[0xf] = uVar57;
                uVar57 = (undefined1)(uVar24 >> 0x30);
                auVar53._14_2_ = auVar54._14_2_;
                auVar53._8_5_ = 0;
                auVar53._0_8_ = uVar24;
                auVar53[0xd] = uVar57;
                auVar52._13_3_ = auVar53._13_3_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar24;
                auVar52[0xc] = uVar57;
                uVar57 = (undefined1)(uVar24 >> 0x28);
                auVar51._12_4_ = auVar52._12_4_;
                auVar51._8_3_ = 0;
                auVar51._0_8_ = uVar24;
                auVar51[0xb] = uVar57;
                auVar50._11_5_ = auVar51._11_5_;
                auVar50._8_2_ = 0;
                auVar50._0_8_ = uVar24;
                auVar50[10] = uVar57;
                uVar57 = (undefined1)(uVar24 >> 0x20);
                auVar49._10_6_ = auVar50._10_6_;
                auVar49[8] = 0;
                auVar49._0_8_ = uVar24;
                auVar49[9] = uVar57;
                auVar48._9_7_ = auVar49._9_7_;
                auVar48[8] = uVar57;
                auVar48._0_8_ = uVar24;
                uVar57 = (undefined1)(uVar24 >> 0x18);
                auVar47._8_8_ = auVar48._8_8_;
                auVar47[7] = uVar57;
                auVar47[6] = uVar57;
                uVar57 = (undefined1)(uVar24 >> 0x10);
                auVar47[5] = uVar57;
                auVar47[4] = uVar57;
                uVar57 = (undefined1)(uVar24 >> 8);
                auVar47[3] = uVar57;
                auVar47[2] = uVar57;
                auVar47[0] = (undefined1)uVar24;
                auVar47[1] = auVar47[0];
                auVar81 = psraw(auVar47,8);
                auVar35._0_2_ = auVar81._0_2_ * auVar72._0_2_;
                auVar35._2_2_ = auVar81._2_2_ * auVar72._2_2_;
                auVar35._4_2_ = auVar81._4_2_ * auVar72._4_2_;
                auVar35._6_2_ = auVar81._6_2_ * auVar72._6_2_;
                auVar35._8_2_ = auVar81._8_2_ * auVar72._8_2_;
                auVar35._10_2_ = auVar81._10_2_ * auVar72._10_2_;
                auVar55._12_2_ = auVar81._12_2_ * auVar72._12_2_;
                auVar55._0_12_ = auVar35;
                auVar55._14_2_ = auVar81._14_2_ * auVar72._14_2_;
                auVar63._4_4_ = auVar55._12_4_;
                auVar63._0_4_ = auVar35._8_4_;
                auVar63._8_4_ = auVar35._8_4_;
                auVar63._12_4_ = auVar55._12_4_;
                uVar59 = SUB164(auVar63 | auVar55,4);
                auVar56._4_4_ = uVar59;
                auVar56._0_4_ = uVar59;
                auVar56._8_4_ = uVar59;
                auVar56._12_4_ = uVar59;
                auVar56 = auVar56 | auVar63 | auVar55;
                uVar27 = piVar11[(ushort)(auVar56._2_2_ | auVar56._0_2_)];
                if ((int)uVar27 < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar15 = 0;
                  do {
                    printf(" %d",(ulong)(uint)(int)*(char *)((long)local_1f8 + lVar15 + uVar17 * 8))
                    ;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 8);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
                             ,0x1319,"fatal error");
                }
                uVar17 = uVar17 | local_258 * 2;
                *(char *)((long)local_220 + uVar17 + 2) = (char)uVar27;
                pbVar3 = (byte *)((long)local_220 + (local_258 >> 1 & 0x7fffffff) + 0x42);
                *pbVar3 = *pbVar3 | (byte)((uVar27 >> 8) << ((char)uVar17 * '\x02' & 6U));
                *(byte *)((long)local_220 + uVar17 + 0x22) = *pbVar18;
                uVar17 = 1;
                pbVar18 = &local_25c;
                bVar12 = false;
              } while (bVar13);
              fVar22 = auVar79._0_4_;
              if (fVar22 < 0.0) {
                pcVar20 = "scale >= 0";
                iVar25 = 0x1320;
                goto LAB_0013aaac;
              }
              afStack_78[local_258] = fVar22;
              fVar60 = local_250;
              if (local_250 <= fVar22) {
                fVar60 = fVar22;
              }
            }
            else {
              afStack_78[local_258] = 0.0;
              fVar60 = local_250;
            }
            uVar17 = local_258 + 1;
            local_210 = local_210 + 0x10;
            local_1a8 = local_1a8 + 0x10;
          } while (uVar17 != 0x10);
          if ((fVar60 != 0.0) || (NAN(fVar60))) {
            fVar33 = (fVar60 / 31.0) * 0.9875;
            fVar22 = (float)(((uint)fVar33 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar33 * 2) < 0x71000000) {
              fVar22 = 2.0;
            }
            fVar22 = fVar22 + ABS(fVar33) * 5.192297e+33 * 7.70372e-34;
            uVar21 = (SUB42(fVar22,0) & 0xfff) + ((ushort)((uint)fVar22 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar33 * 2)) {
              uVar21 = 0x7e00;
            }
            *local_220 = uVar21 | (ushort)((uint)fVar33 >> 0x10) & 0x8000;
            uVar17 = 0;
            do {
              uVar27 = (uint)((afStack_78[uVar17] * (1.0 / (fVar60 / 31.0)) + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
              if (0x40000e < uVar27) {
                uVar27 = 0x40000f;
              }
              if (uVar27 < 0x400001) {
                uVar27 = 0;
              }
              uVar24 = uVar17 >> 1 & 0x7fffffff;
              if ((uVar17 & 1) == 0) {
                *(char *)((long)local_220 + uVar24 + 0x4a) = (char)uVar27;
              }
              else {
                pbVar18 = (byte *)((long)local_220 + uVar24 + 0x4a);
                *pbVar18 = *pbVar18 | (char)uVar27 << 4;
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != 0x10);
          }
          lVar15 = local_178 + 1;
          pfVar19 = local_228 + 0x100;
          local_1b8 = local_1b8 + 0x100;
        } while (lVar15 != local_248[3]);
      }
      local_218 = (float *)((long)local_218 + local_190);
      local_1c0 = (void *)((long)local_1c0 + local_198);
      lVar15 = local_180 + 1;
      nrow = local_188;
    } while (lVar15 != local_188);
  }
  return nrow * local_248[3] * 0x52;
}

Assistant:

size_t quantize_iq2_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_s_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_s);
    }
    return nrow * nblock * sizeof(block_iq2_s);
}